

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

bool __thiscall VmaDedicatedAllocationList::IsEmpty(VmaDedicatedAllocationList *this)

{
  size_t sVar1;
  VmaMutexLockRead lock;
  VmaMutexLockRead local_10;
  
  local_10.m_pMutex = (VmaRWMutex *)0x0;
  if (this->m_UseMutex != false) {
    local_10.m_pMutex = &this->m_Mutex;
  }
  if (this->m_UseMutex == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
  }
  sVar1 = (this->m_AllocationList).m_Count;
  VmaMutexLockRead::~VmaMutexLockRead(&local_10);
  return sVar1 == 0;
}

Assistant:

bool VmaDedicatedAllocationList::IsEmpty()
{
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);
    return m_AllocationList.IsEmpty();
}